

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

int side3_7d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  
  dVar47 = p0[1];
  dVar4 = p1[1] - dVar47;
  dVar24 = p0[2];
  dVar45 = p1[2] - dVar24;
  dVar49 = p0[3];
  dVar20 = p1[3] - dVar49;
  dVar62 = p0[4];
  dVar30 = p1[4] - dVar62;
  dVar42 = p0[5];
  dVar25 = p1[5] - dVar42;
  dVar59 = p0[6];
  dVar51 = p1[6] - dVar59;
  dVar17 = ABS(dVar20);
  if (ABS(dVar20) <= ABS(dVar4)) {
    dVar17 = ABS(dVar4);
  }
  dVar39 = ABS(dVar25);
  if (ABS(dVar25) <= dVar17) {
    dVar39 = dVar17;
  }
  dVar17 = ABS(dVar30);
  if (ABS(dVar30) <= dVar39) {
    dVar17 = dVar39;
  }
  dVar39 = ABS(dVar51);
  if (ABS(dVar51) <= dVar17) {
    dVar39 = dVar17;
  }
  dVar17 = ABS(dVar45);
  if (ABS(dVar45) <= dVar39) {
    dVar17 = dVar39;
  }
  dVar39 = *p0;
  dVar43 = *p1 - dVar39;
  dVar44 = ABS(dVar43);
  if (ABS(dVar43) <= dVar17) {
    dVar44 = dVar17;
  }
  dVar5 = *p2 - dVar39;
  dVar21 = p2[1] - dVar47;
  dVar17 = ABS(dVar21);
  if (ABS(dVar21) <= ABS(dVar5)) {
    dVar17 = ABS(dVar5);
  }
  dVar6 = p2[2] - dVar24;
  dVar8 = ABS(dVar6);
  if (ABS(dVar6) <= dVar17) {
    dVar8 = dVar17;
  }
  dVar22 = p2[3] - dVar49;
  dVar17 = ABS(dVar22);
  if (ABS(dVar22) <= dVar8) {
    dVar17 = dVar8;
  }
  dVar7 = p2[4] - dVar62;
  dVar8 = ABS(dVar7);
  if (ABS(dVar7) <= dVar17) {
    dVar8 = dVar17;
  }
  dVar31 = p2[5] - dVar42;
  dVar17 = ABS(dVar31);
  if (ABS(dVar31) <= dVar8) {
    dVar17 = dVar8;
  }
  dVar23 = p2[6] - dVar59;
  dVar8 = ABS(dVar23);
  if (ABS(dVar23) <= dVar17) {
    dVar8 = dVar17;
  }
  dVar9 = *q0 - dVar39;
  dVar32 = q0[1] - dVar47;
  dVar17 = ABS(dVar32);
  if (ABS(dVar32) <= ABS(dVar9)) {
    dVar17 = ABS(dVar9);
  }
  dVar10 = q0[2] - dVar24;
  dVar16 = ABS(dVar10);
  if (ABS(dVar10) <= dVar17) {
    dVar16 = dVar17;
  }
  dVar33 = q0[3] - dVar49;
  dVar17 = ABS(dVar33);
  if (ABS(dVar33) <= dVar16) {
    dVar17 = dVar16;
  }
  dVar11 = q0[4] - dVar62;
  dVar16 = ABS(dVar11);
  if (ABS(dVar11) <= dVar17) {
    dVar16 = dVar17;
  }
  dVar34 = q0[5] - dVar42;
  dVar17 = ABS(dVar34);
  if (ABS(dVar34) <= dVar16) {
    dVar17 = dVar16;
  }
  dVar12 = q0[6] - dVar59;
  dVar16 = ABS(dVar12);
  if (ABS(dVar12) <= dVar17) {
    dVar16 = dVar17;
  }
  dVar35 = *q1 - dVar39;
  dVar17 = ABS(dVar35);
  if (ABS(dVar35) <= dVar16) {
    dVar17 = dVar16;
  }
  dVar52 = q1[1] - dVar47;
  dVar16 = ABS(dVar52);
  if (ABS(dVar52) <= dVar17) {
    dVar16 = dVar17;
  }
  dVar56 = q1[2] - dVar24;
  dVar17 = ABS(dVar56);
  if (ABS(dVar56) <= dVar16) {
    dVar17 = dVar16;
  }
  dVar63 = q1[3] - dVar49;
  dVar16 = ABS(dVar63);
  if (ABS(dVar63) <= dVar17) {
    dVar16 = dVar17;
  }
  dVar36 = q1[4] - dVar62;
  dVar17 = ABS(dVar36);
  if (ABS(dVar36) <= dVar16) {
    dVar17 = dVar16;
  }
  dVar13 = q1[5] - dVar42;
  dVar16 = ABS(dVar13);
  if (ABS(dVar13) <= dVar17) {
    dVar16 = dVar17;
  }
  dVar37 = q1[6] - dVar59;
  dVar17 = ABS(dVar37);
  if (ABS(dVar37) <= dVar16) {
    dVar17 = dVar16;
  }
  dVar14 = *q2 - dVar39;
  dVar16 = ABS(dVar14);
  if (ABS(dVar14) <= dVar17) {
    dVar16 = dVar17;
  }
  dVar38 = q2[1] - dVar47;
  dVar17 = ABS(dVar38);
  if (ABS(dVar38) <= dVar16) {
    dVar17 = dVar16;
  }
  dVar54 = q2[2] - dVar24;
  dVar16 = ABS(dVar54);
  if (ABS(dVar54) <= dVar17) {
    dVar16 = dVar17;
  }
  dVar41 = q2[3] - dVar49;
  dVar17 = ABS(dVar41);
  if (ABS(dVar41) <= dVar16) {
    dVar17 = dVar16;
  }
  dVar15 = q2[4] - dVar62;
  dVar16 = ABS(dVar15);
  if (ABS(dVar15) <= dVar17) {
    dVar16 = dVar17;
  }
  dVar60 = q2[5] - dVar42;
  dVar17 = ABS(dVar60);
  if (ABS(dVar60) <= dVar16) {
    dVar17 = dVar16;
  }
  dVar26 = q2[6] - dVar59;
  dVar16 = ABS(dVar26);
  if (ABS(dVar26) <= dVar17) {
    dVar16 = dVar17;
  }
  dVar17 = dVar44;
  dVar27 = dVar8;
  if ((dVar8 <= dVar44) && (dVar17 = dVar8, dVar8 < dVar44)) {
    dVar27 = dVar44;
  }
  dVar28 = dVar16;
  if ((dVar17 <= dVar16) && (dVar28 = dVar17, dVar27 < dVar16)) {
    dVar27 = dVar16;
  }
  iVar3 = 0;
  iVar2 = 0;
  if ((1.369188811838835e-74 <= dVar28) && (iVar2 = iVar3, dVar27 <= 1.2980742146337065e+33)) {
    dVar57 = dVar51 * dVar12 +
             dVar25 * dVar34 +
             dVar30 * dVar11 + dVar20 * dVar33 + dVar45 * dVar10 + dVar43 * dVar9 + dVar4 * dVar32;
    dVar17 = dVar51 * dVar37 +
             dVar25 * dVar13 +
             dVar30 * dVar36 + dVar20 * dVar63 + dVar45 * dVar56 + dVar43 * dVar35 + dVar4 * dVar52;
    dVar48 = dVar51 * dVar26 +
             dVar25 * dVar60 +
             dVar30 * dVar15 + dVar20 * dVar41 + dVar45 * dVar54 + dVar43 * dVar14 + dVar4 * dVar38;
    dVar27 = dVar23 * dVar12 +
             dVar31 * dVar34 +
             dVar7 * dVar11 + dVar22 * dVar33 + dVar6 * dVar10 + dVar5 * dVar9 + dVar21 * dVar32;
    dVar50 = dVar23 * dVar37 +
             dVar31 * dVar13 +
             dVar7 * dVar36 + dVar22 * dVar63 + dVar6 * dVar56 + dVar5 * dVar35 + dVar21 * dVar52;
    dVar64 = dVar23 * dVar26 +
             dVar31 * dVar60 +
             dVar7 * dVar15 + dVar22 * dVar41 + dVar6 * dVar54 + dVar5 * dVar14 + dVar21 * dVar38;
    dVar57 = dVar57 + dVar57;
    dVar17 = dVar17 + dVar17;
    dVar48 = dVar48 + dVar48;
    dVar27 = dVar27 + dVar27;
    dVar50 = dVar50 + dVar50;
    dVar64 = dVar64 + dVar64;
    dVar53 = dVar17 * dVar64 - dVar50 * dVar48;
    dVar46 = dVar48 * dVar27 - dVar64 * dVar57;
    dVar58 = dVar57 * dVar50 - dVar27 * dVar17;
    dVar28 = dVar53 + dVar46 + dVar58;
    dVar61 = dVar44 * dVar16 * dVar8 * dVar16 * 6.33127335329799e-13;
    iVar3 = 1;
    if ((dVar61 < dVar28) || (iVar3 = -1, dVar28 < -dVar61)) {
      dVar39 = *p3 - dVar39;
      dVar47 = p3[1] - dVar47;
      dVar24 = p3[2] - dVar24;
      dVar49 = p3[3] - dVar49;
      dVar62 = p3[4] - dVar62;
      dVar42 = p3[5] - dVar42;
      dVar59 = p3[6] - dVar59;
      dVar61 = dVar16;
      if (dVar16 <= dVar44) {
        dVar61 = dVar44;
      }
      dVar29 = dVar8;
      if (dVar8 <= dVar61) {
        dVar29 = dVar61;
      }
      dVar19 = ABS(dVar39);
      if (ABS(dVar39) <= dVar44) {
        dVar19 = dVar44;
      }
      dVar18 = ABS(dVar47);
      if (ABS(dVar47) <= dVar19) {
        dVar18 = dVar19;
      }
      dVar19 = ABS(dVar24);
      if (ABS(dVar24) <= dVar18) {
        dVar19 = dVar18;
      }
      dVar18 = ABS(dVar49);
      if (ABS(dVar49) <= dVar19) {
        dVar18 = dVar19;
      }
      dVar19 = ABS(dVar62);
      if (ABS(dVar62) <= dVar18) {
        dVar19 = dVar18;
      }
      dVar18 = ABS(dVar42);
      if (ABS(dVar42) <= dVar19) {
        dVar18 = dVar19;
      }
      dVar19 = ABS(dVar59);
      if (ABS(dVar59) <= dVar18) {
        dVar19 = dVar18;
      }
      dVar18 = dVar19;
      if (dVar19 <= dVar29) {
        dVar18 = dVar29;
      }
      dVar29 = dVar44;
      if (dVar44 <= dVar18) {
        dVar29 = dVar18;
      }
      dVar18 = dVar16;
      if (dVar16 <= dVar29) {
        dVar18 = dVar29;
      }
      dVar29 = dVar19;
      if (dVar19 <= dVar61) {
        dVar29 = dVar61;
      }
      if (dVar44 <= dVar29) {
        dVar44 = dVar29;
      }
      dVar29 = dVar16;
      if (dVar16 <= dVar44) {
        dVar29 = dVar44;
      }
      dVar44 = dVar29;
      if (dVar29 <= dVar18) {
        dVar44 = dVar18;
      }
      dVar18 = dVar8;
      if (dVar61 <= dVar8) {
        dVar18 = dVar61;
      }
      dVar40 = dVar19;
      if (dVar18 <= dVar19) {
        dVar40 = dVar18;
      }
      dVar18 = dVar44;
      dVar55 = dVar61;
      if ((dVar40 <= dVar44) && (dVar18 = dVar40, dVar61 < dVar44)) {
        dVar55 = dVar44;
      }
      dVar40 = dVar16;
      if (dVar18 <= dVar16) {
        dVar40 = dVar18;
      }
      dVar18 = dVar29;
      if (dVar40 <= dVar29) {
        dVar18 = dVar40;
      }
      if ((3.045483035656025e-50 <= dVar18) && (dVar55 <= 1.2980742146337065e+33)) {
        dVar25 = dVar51 * dVar51 +
                 dVar25 * dVar25 +
                 dVar30 * dVar30 +
                 dVar20 * dVar20 + dVar45 * dVar45 + dVar43 * dVar43 + dVar4 * dVar4;
        dVar4 = dVar23 * dVar23 +
                dVar31 * dVar31 +
                dVar7 * dVar7 + dVar22 * dVar22 + dVar6 * dVar6 + dVar5 * dVar5 + dVar21 * dVar21;
        dVar45 = dVar12 * dVar59 +
                 dVar34 * dVar42 +
                 dVar11 * dVar62 +
                 dVar33 * dVar49 + dVar10 * dVar24 + dVar9 * dVar39 + dVar32 * dVar47;
        dVar51 = dVar37 * dVar59 +
                 dVar13 * dVar42 +
                 dVar36 * dVar62 +
                 dVar63 * dVar49 + dVar56 * dVar24 + dVar35 * dVar39 + dVar52 * dVar47;
        dVar30 = dVar26 * dVar59 +
                 dVar60 * dVar42 +
                 dVar15 * dVar62 +
                 dVar41 * dVar49 + dVar54 * dVar24 + dVar14 * dVar39 + dVar38 * dVar47;
        dVar20 = dVar8 * dVar19 * dVar16 * dVar61 * dVar29 * dVar44 * 2.7887354880433616e-11;
        dVar47 = dVar28 * (dVar59 * dVar59 +
                          dVar42 * dVar42 +
                          dVar62 * dVar62 +
                          dVar49 * dVar49 + dVar24 * dVar24 + dVar39 * dVar39 + dVar47 * dVar47) -
                 ((dVar58 + (dVar27 - dVar50) * dVar25 + (dVar17 - dVar57) * dVar4) *
                  (dVar30 + dVar30) +
                 (dVar46 + (dVar64 - dVar27) * dVar25 + (dVar57 - dVar48) * dVar4) *
                 (dVar51 + dVar51) +
                 (dVar53 + (dVar50 - dVar64) * dVar25 + (dVar48 - dVar17) * dVar4) *
                 (dVar45 + dVar45));
        iVar1 = 1;
        if ((dVar20 < dVar47) || (iVar1 = -1, dVar47 < -dVar20)) {
          iVar2 = iVar1 * iVar3;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

inline int side3_7d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double l1;
    l1 = (1 * (((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)) + (p1_6_p0_6 * p1_6_p0_6)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double p2_6_p0_6 = (p2[6] - p0[6]);
    double l2;
    l2 = (1 * (((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)) + (p2_6_p0_6 * p2_6_p0_6)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double p3_4_p0_4 = (p3[4] - p0[4]);
    double p3_5_p0_5 = (p3[5] - p0[5]);
    double p3_6_p0_6 = (p3[6] - p0[6]);
    double l3;
    l3 = (1 * (((((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)) + (p3_4_p0_4 * p3_4_p0_4)) + (p3_5_p0_5 * p3_5_p0_5)) + (p3_6_p0_6 * p3_6_p0_6)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double a10;
    a10 = (2 * (((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double q1_6_p0_6 = (q1[6] - p0[6]);
    double a11;
    a11 = (2 * (((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)) + (p1_6_p0_6 * q1_6_p0_6)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double q2_4_p0_4 = (q2[4] - p0[4]);
    double q2_5_p0_5 = (q2[5] - p0[5]);
    double q2_6_p0_6 = (q2[6] - p0[6]);
    double a12;
    a12 = (2 * (((((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)) + (p1_4_p0_4 * q2_4_p0_4)) + (p1_5_p0_5 * q2_5_p0_5)) + (p1_6_p0_6 * q2_6_p0_6)));
    double a20;
    a20 = (2 * (((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)) + (p2_6_p0_6 * q0_6_p0_6)));
    double a21;
    a21 = (2 * (((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)) + (p2_6_p0_6 * q1_6_p0_6)));
    double a22;
    a22 = (2 * (((((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)) + (p2_4_p0_4 * q2_4_p0_4)) + (p2_5_p0_5 * q2_5_p0_5)) + (p2_6_p0_6 * q2_6_p0_6)));
    double a30;
    a30 = (2 * (((((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)) + (p3_4_p0_4 * q0_4_p0_4)) + (p3_5_p0_5 * q0_5_p0_5)) + (p3_6_p0_6 * q0_6_p0_6)));
    double a31;
    a31 = (2 * (((((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)) + (p3_4_p0_4 * q1_4_p0_4)) + (p3_5_p0_5 * q1_5_p0_5)) + (p3_6_p0_6 * q1_6_p0_6)));
    double a32;
    a32 = (2 * (((((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)) + (p3_4_p0_4 * q2_4_p0_4)) + (p3_5_p0_5 * q2_5_p0_5)) + (p3_6_p0_6 * q2_6_p0_6)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p1_1_p0_1);
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    double max2 = fabs(p2_0_p0_0);
    if( (max2 < fabs(p2_1_p0_1)) )
    {
        max2 = fabs(p2_1_p0_1);
    } 
    if( (max2 < fabs(p2_2_p0_2)) )
    {
        max2 = fabs(p2_2_p0_2);
    } 
    if( (max2 < fabs(p2_3_p0_3)) )
    {
        max2 = fabs(p2_3_p0_3);
    } 
    if( (max2 < fabs(p2_4_p0_4)) )
    {
        max2 = fabs(p2_4_p0_4);
    } 
    if( (max2 < fabs(p2_5_p0_5)) )
    {
        max2 = fabs(p2_5_p0_5);
    } 
    if( (max2 < fabs(p2_6_p0_6)) )
    {
        max2 = fabs(p2_6_p0_6);
    } 
    double max3 = fabs(q0_0_p0_0);
    if( (max3 < fabs(q0_1_p0_1)) )
    {
        max3 = fabs(q0_1_p0_1);
    } 
    if( (max3 < fabs(q0_2_p0_2)) )
    {
        max3 = fabs(q0_2_p0_2);
    } 
    if( (max3 < fabs(q0_3_p0_3)) )
    {
        max3 = fabs(q0_3_p0_3);
    } 
    if( (max3 < fabs(q0_4_p0_4)) )
    {
        max3 = fabs(q0_4_p0_4);
    } 
    if( (max3 < fabs(q0_5_p0_5)) )
    {
        max3 = fabs(q0_5_p0_5);
    } 
    if( (max3 < fabs(q0_6_p0_6)) )
    {
        max3 = fabs(q0_6_p0_6);
    } 
    if( (max3 < fabs(q1_0_p0_0)) )
    {
        max3 = fabs(q1_0_p0_0);
    } 
    if( (max3 < fabs(q1_1_p0_1)) )
    {
        max3 = fabs(q1_1_p0_1);
    } 
    if( (max3 < fabs(q1_2_p0_2)) )
    {
        max3 = fabs(q1_2_p0_2);
    } 
    if( (max3 < fabs(q1_3_p0_3)) )
    {
        max3 = fabs(q1_3_p0_3);
    } 
    if( (max3 < fabs(q1_4_p0_4)) )
    {
        max3 = fabs(q1_4_p0_4);
    } 
    if( (max3 < fabs(q1_5_p0_5)) )
    {
        max3 = fabs(q1_5_p0_5);
    } 
    if( (max3 < fabs(q1_6_p0_6)) )
    {
        max3 = fabs(q1_6_p0_6);
    } 
    if( (max3 < fabs(q2_0_p0_0)) )
    {
        max3 = fabs(q2_0_p0_0);
    } 
    if( (max3 < fabs(q2_1_p0_1)) )
    {
        max3 = fabs(q2_1_p0_1);
    } 
    if( (max3 < fabs(q2_2_p0_2)) )
    {
        max3 = fabs(q2_2_p0_2);
    } 
    if( (max3 < fabs(q2_3_p0_3)) )
    {
        max3 = fabs(q2_3_p0_3);
    } 
    if( (max3 < fabs(q2_4_p0_4)) )
    {
        max3 = fabs(q2_4_p0_4);
    } 
    if( (max3 < fabs(q2_5_p0_5)) )
    {
        max3 = fabs(q2_5_p0_5);
    } 
    if( (max3 < fabs(q2_6_p0_6)) )
    {
        max3 = fabs(q2_6_p0_6);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.36918881183883509035e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (6.33127335329798996022e-13 * (((max1 * max3) * max2) * max3));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4;
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    max4 = max7;
    if( (max4 < max2) )
    {
        max4 = max2;
    } 
    double max5 = max1;
    if( (max5 < fabs(p3_0_p0_0)) )
    {
        max5 = fabs(p3_0_p0_0);
    } 
    if( (max5 < fabs(p3_1_p0_1)) )
    {
        max5 = fabs(p3_1_p0_1);
    } 
    if( (max5 < fabs(p3_2_p0_2)) )
    {
        max5 = fabs(p3_2_p0_2);
    } 
    if( (max5 < fabs(p3_3_p0_3)) )
    {
        max5 = fabs(p3_3_p0_3);
    } 
    if( (max5 < fabs(p3_4_p0_4)) )
    {
        max5 = fabs(p3_4_p0_4);
    } 
    if( (max5 < fabs(p3_5_p0_5)) )
    {
        max5 = fabs(p3_5_p0_5);
    } 
    if( (max5 < fabs(p3_6_p0_6)) )
    {
        max5 = fabs(p3_6_p0_6);
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    if( (max4 < max1) )
    {
        max4 = max1;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    double max6 = max7;
    if( (max6 < max5) )
    {
        max6 = max5;
    } 
    if( (max6 < max1) )
    {
        max6 = max1;
    } 
    if( (max6 < max3) )
    {
        max6 = max3;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max7;
    upper_bound_1 = max7;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (lower_bound_1 < 3.04548303565602498901e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (2.78873548804336160566e-11 * (((((max5 * max3) * max2) * max7) * max6) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}